

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O1

SchnorrSignature *
cfd::core::SchnorrUtil::SignWithNonce
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,Privkey *nonce)

{
  ByteData local_38;
  
  Privkey::GetData(&local_38,nonce);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)&ConstantNonce,
             &local_38);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::SignWithNonce(
    const ByteData256 &msg, const Privkey &sk, const Privkey &nonce) {
  return SignCommon(msg, sk, &ConstantNonce, nonce.GetData());
}